

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::
~basic_memory_buffer(basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *this)

{
  ~basic_memory_buffer(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }